

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::GroupNode> __thiscall
embree::SceneGraph::flatten
          (SceneGraph *this,Ref<embree::SceneGraph::GroupNode> *node,InstancingMode mode)

{
  GroupNode *pGVar1;
  long *plVar2;
  Ref<embree::SceneGraph::Node> local_30;
  long *local_28;
  
  pGVar1 = node->ptr;
  local_30.ptr = &pGVar1->super_Node;
  if (pGVar1 != (GroupNode *)0x0) {
    (*(pGVar1->super_Node).super_RefCount._vptr_RefCount[2])(pGVar1);
  }
  flatten((SceneGraph *)&local_28,&local_30,mode);
  if (local_28 == (long *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(local_28,&Node::typeinfo,&GroupNode::typeinfo,0);
    *(long **)this = plVar2;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))(plVar2);
    }
    (**(code **)(*local_28 + 0x18))(local_28);
  }
  if (pGVar1 != (GroupNode *)0x0) {
    (*(pGVar1->super_Node).super_RefCount._vptr_RefCount[3])(pGVar1);
  }
  return (Ref<embree::SceneGraph::GroupNode>)(GroupNode *)this;
}

Assistant:

Ref<SceneGraph::GroupNode> SceneGraph::flatten(Ref<SceneGraph::GroupNode> node, SceneGraph::InstancingMode mode) {
    return flatten(node.dynamicCast<SceneGraph::Node>(),mode).dynamicCast<SceneGraph::GroupNode>();
  }